

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv2srt.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  char *flv_00;
  int iVar2;
  flvtag_avcpackettype_t fVar3;
  libcaption_stauts_t lVar4;
  FILE *flv_01;
  srt_t *srt_00;
  long lVar5;
  flvtag_t *tag_00;
  mpeg_bitstream_t *packet;
  size_t nalu_size;
  uint8_t *data;
  ssize_t size;
  FILE *flv;
  char *path;
  mpeg_bitstream_t mpegbs;
  caption_frame_t frame;
  int has_video;
  int has_audio;
  srt_t *srt;
  flvtag_t tag;
  char **argv_local;
  int argc_local;
  
  flv_00 = argv[1];
  tag.aloc = (size_t)argv;
  flvtag_init((flvtag_t *)&srt);
  caption_frame_init((caption_frame_t *)0x1042e5);
  mpeg_bitstream_init((mpeg_bitstream_t *)&path);
  flv_01 = flv_open_read(flv_00);
  srt_00 = srt_new();
  iVar2 = flv_read_header(flv_01,(int *)&frame.field_0x1e4c,(int *)&frame.status);
  if (iVar2 == 0) {
    fprintf(_stderr,"\'%s\' Not an flv file\n",flv_00);
  }
  else {
    fprintf(_stderr,"Reading from \'%s\'\n",flv_00);
  }
  do {
    do {
      iVar2 = flv_read_tag(flv_01,(flvtag_t *)&srt);
      if (iVar2 == 0) {
        srt_dump((srt_t *)path);
        srt_free((srt_t *)0x10458f);
        return 1;
      }
      fVar3 = flvtag_avcpackettype((flvtag_t *)&srt);
    } while (fVar3 != flvtag_avcpackettype_nalu);
    data = (uint8_t *)flvtag_payload_size((flvtag_t *)&srt);
    nalu_size = (size_t)flvtag_payload_data((flvtag_t *)&srt);
    while (0 < (long)data) {
      uVar1 = *(uint *)nalu_size;
      lVar5 = (long)(int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18);
      tag_00 = (flvtag_t *)&srt;
      flvtag_dts_seconds(tag_00);
      flvtag_cts_seconds(tag_00);
      packet = (mpeg_bitstream_t *)&path;
      flv._4_4_ = (uint)((ulong)flv_00 >> 0x20);
      mpeg_bitstream_parse
                ((mpeg_bitstream_t *)mpegbs.data._8_8_,(caption_frame_t *)mpegbs.data._0_8_,
                 (uint8_t *)mpegbs.size,(size_t)path,flv._4_4_,(double)flv_01,(double)data);
      flvtag_dts_seconds(tag_00);
      flvtag_cts_seconds(tag_00);
      mpeg_bitstream_parse
                ((mpeg_bitstream_t *)mpegbs.data._8_8_,(caption_frame_t *)mpegbs.data._0_8_,
                 (uint8_t *)mpegbs.size,(size_t)path,flv._4_4_,(double)flv_01,(double)data);
      nalu_size = lVar5 + 4 + nalu_size;
      data = data + (-4 - lVar5);
      lVar4 = mpeg_bitstream_status(packet);
      if (lVar4 == LIBCAPTION_ERROR) goto LAB_00104526;
      if (lVar4 != LIBCAPTION_OK) {
        if (lVar4 != LIBCAPTION_READY) {
LAB_00104526:
          fprintf(_stderr,"LIBCAPTION_ERROR == mpeg_bitstream_parse()\n");
          mpeg_bitstream_init((mpeg_bitstream_t *)&path);
          return 1;
        }
        caption_frame_dump((caption_frame_t *)mpegbs.data._8048_8_);
        srt_cue_from_caption_frame((caption_frame_t *)&mpegbs.cea708[0x3f].timestamp,srt_00);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    flvtag_t tag;
    srt_t* srt = 0;
    int has_audio, has_video;
    caption_frame_t frame;
    mpeg_bitstream_t mpegbs;
    const char* path = argv[1];

    flvtag_init(&tag);
    caption_frame_init(&frame);
    mpeg_bitstream_init(&mpegbs);

    FILE* flv = flv_open_read(path);
    srt = srt_new();

    if (!flv_read_header(flv, &has_audio, &has_video)) {
        fprintf(stderr, "'%s' Not an flv file\n", path);
    } else {
        fprintf(stderr, "Reading from '%s'\n", path);
    }

    while (flv_read_tag(flv, &tag)) {
        if (flvtag_avcpackettype_nalu == flvtag_avcpackettype(&tag)) {
            ssize_t size = flvtag_payload_size(&tag);
            uint8_t* data = flvtag_payload_data(&tag);

            while (0 < size) {
                size_t nalu_size = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
                mpeg_bitstream_parse(&mpegbs, &frame, (const uint8_t*)"\0\0\1", 3, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                mpeg_bitstream_parse(&mpegbs, &frame, &data[LENGTH_SIZE], nalu_size, STREAM_TYPE_H264, flvtag_dts_seconds(&tag), flvtag_cts_seconds(&tag));
                data += nalu_size + LENGTH_SIZE, size -= nalu_size + LENGTH_SIZE;
                switch (mpeg_bitstream_status(&mpegbs)) {
                default:
                case LIBCAPTION_ERROR:
                    fprintf(stderr, "LIBCAPTION_ERROR == mpeg_bitstream_parse()\n");
                    mpeg_bitstream_init(&mpegbs);
                    return EXIT_FAILURE;
                    break;

                case LIBCAPTION_OK:
                    break;

                case LIBCAPTION_READY: {
                    caption_frame_dump(&frame);
                    srt_cue_from_caption_frame(&frame, srt);
                } break;
                } //switch
            }
        }
    }

    srt_dump(srt);
    srt_free(srt);

    return 1;
}